

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVector.cpp
# Opt level: O0

size_t __thiscall celero::TestVector::size(TestVector *this)

{
  Impl *pIVar1;
  size_type sVar2;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> mutexLock;
  TestVector *this_local;
  
  mutexLock._M_device = (mutex_type *)this;
  pIVar1 = Pimpl<celero::TestVector::Impl>::operator->(&this->pimpl);
  std::lock_guard<std::mutex>::lock_guard(&local_18,&pIVar1->testVectorMutex);
  pIVar1 = Pimpl<celero::TestVector::Impl>::operator->(&this->pimpl);
  sVar2 = std::
          vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>
          ::size(&pIVar1->testVector);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return sVar2;
}

Assistant:

size_t TestVector::size() const
{
	std::lock_guard<std::mutex> mutexLock(this->pimpl->testVectorMutex);
	return this->pimpl->testVector.size();
}